

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psl.c
# Opt level: O3

psl_ctx_t * Curl_psl_use(Curl_easy *easy)

{
  PslCache *pPVar1;
  long lVar2;
  psl_ctx_t *ppVar3;
  long lVar4;
  bool bVar5;
  curltime cVar6;
  
  pPVar1 = easy->psl;
  if (pPVar1 != (PslCache *)0x0) {
    Curl_share_lock(easy,CURL_LOCK_DATA_PSL,CURL_LOCK_ACCESS_SHARED);
    cVar6 = Curl_now();
    if ((pPVar1->psl != (psl_ctx_t *)0x0) && (cVar6.tv_sec < pPVar1->expires)) {
      return pPVar1->psl;
    }
    Curl_share_unlock(easy,CURL_LOCK_DATA_PSL);
    Curl_share_lock(easy,CURL_LOCK_DATA_PSL,CURL_LOCK_ACCESS_SINGLE);
    cVar6 = Curl_now();
    lVar2 = cVar6.tv_sec;
    if ((pPVar1->psl == (psl_ctx_t *)0x0) || (pPVar1->expires <= lVar2)) {
      ppVar3 = (psl_ctx_t *)psl_latest(0);
      lVar4 = 0x7ffffffffffc0b7f;
      if (lVar2 < 0x7ffffffffffc0b7f) {
        lVar4 = lVar2;
      }
      bVar5 = ppVar3 != (psl_ctx_t *)0x0;
      if ((bVar5) ||
         ((pPVar1->dynamic == false &&
          (ppVar3 = (psl_ctx_t *)psl_builtin(), ppVar3 != (psl_ctx_t *)0x0)))) {
        if ((pPVar1->psl != (psl_ctx_t *)0x0) && (pPVar1->dynamic == true)) {
          psl_free();
        }
        pPVar1->psl = ppVar3;
        pPVar1->dynamic = bVar5;
        pPVar1->expires = lVar4 + 0x3f480;
      }
    }
    Curl_share_unlock(easy,CURL_LOCK_DATA_PSL);
    Curl_share_lock(easy,CURL_LOCK_DATA_PSL,CURL_LOCK_ACCESS_SHARED);
    if (pPVar1->psl != (psl_ctx_t *)0x0) {
      return pPVar1->psl;
    }
    Curl_share_unlock(easy,CURL_LOCK_DATA_PSL);
  }
  return (psl_ctx_t *)0x0;
}

Assistant:

const psl_ctx_t *Curl_psl_use(struct Curl_easy *easy)
{
  struct PslCache *pslcache = easy->psl;
  const psl_ctx_t *psl;
  time_t now;

  if(!pslcache)
    return NULL;

  Curl_share_lock(easy, CURL_LOCK_DATA_PSL, CURL_LOCK_ACCESS_SHARED);
  now = now_seconds();
  if(!pslcache->psl || pslcache->expires <= now) {
    /* Let a chance to other threads to do the job: avoids deadlock. */
    Curl_share_unlock(easy, CURL_LOCK_DATA_PSL);

    /* Update cache: this needs an exclusive lock. */
    Curl_share_lock(easy, CURL_LOCK_DATA_PSL, CURL_LOCK_ACCESS_SINGLE);

    /* Recheck in case another thread did the job. */
    now = now_seconds();
    if(!pslcache->psl || pslcache->expires <= now) {
      bool dynamic = FALSE;
      time_t expires = TIME_T_MAX;

#if defined(PSL_VERSION_NUMBER) && PSL_VERSION_NUMBER >= 0x001000
      psl = psl_latest(NULL);
      dynamic = psl != NULL;
      /* Take care of possible time computation overflow. */
      expires = now < TIME_T_MAX - PSL_TTL ? now + PSL_TTL : TIME_T_MAX;

      /* Only get the built-in PSL if we do not already have the "latest". */
      if(!psl && !pslcache->dynamic)
#endif

        psl = psl_builtin();

      if(psl) {
        Curl_psl_destroy(pslcache);
        pslcache->psl = psl;
        pslcache->dynamic = dynamic;
        pslcache->expires = expires;
      }
    }
    Curl_share_unlock(easy, CURL_LOCK_DATA_PSL);  /* Release exclusive lock. */
    Curl_share_lock(easy, CURL_LOCK_DATA_PSL, CURL_LOCK_ACCESS_SHARED);
  }
  psl = pslcache->psl;
  if(!psl)
    Curl_share_unlock(easy, CURL_LOCK_DATA_PSL);
  return psl;
}